

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O1

bool __thiscall
TOICompactRewardDecPOMDPDiscrete::SetInitialized(TOICompactRewardDecPOMDPDiscrete *this,bool b)

{
  pointer ppRVar1;
  pointer ppRVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  unsigned_long uVar9;
  E *this_00;
  undefined7 in_register_00000031;
  Index i;
  uint uVar10;
  
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
    b = false;
  }
  else {
    bVar3 = TOIDecPOMDPDiscrete::SetInitialized(&this->super_TOIDecPOMDPDiscrete,true);
    if (!bVar3) {
      return false;
    }
    if (b) {
      ppRVar1 = (this->_m_p_rModels).
                super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppRVar2 = (this->_m_p_rModels).
                super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar4 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                     super_TransitionObservationIndependentMADPDiscrete.
                                     super_MultiAgentDecisionProcess + 0x10))(this);
      if ((long)ppRVar1 - (long)ppRVar2 >> 3 != lVar4) {
        this_00 = (E *)__cxa_allocate_exception(0x28);
        E::E(this_00,
             "TOICompactRewardDecPOMDPDiscrete::SetInitialized(true) : no reward models specified yet!"
            );
LAB_00474bfe:
        __cxa_throw(this_00,&E::typeinfo,E::~E);
      }
      lVar4 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                     super_TransitionObservationIndependentMADPDiscrete.
                                     super_MultiAgentDecisionProcess + 0x10))(this);
      if (lVar4 != 0) {
        uVar10 = 1;
        uVar7 = 0;
        do {
          if ((this->_m_p_rModels).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar7] == (RewardModel *)0x0) {
            this_00 = (E *)__cxa_allocate_exception(0x28);
            E::E(this_00,
                 "TOICompactRewardDecPOMDPDiscrete::SetInitialized(true) : no reward model specified yet! ( _m_p_rModels[i] == 0 )"
                );
            goto LAB_00474bfe;
          }
          uVar7 = (ulong)uVar10;
          uVar5 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                         super_TransitionObservationIndependentMADPDiscrete.
                                         super_MultiAgentDecisionProcess + 0x10))(this);
          uVar10 = uVar10 + 1;
        } while (uVar5 != uVar7);
      }
      lVar4 = (**(code **)(*(long *)&((*(this->super_TOIDecPOMDPDiscrete)._m_individualDecPOMDPDs.
                                        super__Vector_base<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                     super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 0x30))();
      lVar6 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                     super_TransitionObservationIndependentMADPDiscrete.
                                     super_MultiAgentDecisionProcess + 0x10))(this);
      if (lVar6 != 0) {
        uVar7 = 0;
        uVar5 = 1;
        do {
          lVar6 = (**(code **)(*(long *)&((this->super_TOIDecPOMDPDiscrete)._m_individualDecPOMDPDs.
                                          super__Vector_base<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar7]->
                                         super_MultiAgentDecisionProcessDiscrete).
                                         super_MultiAgentDecisionProcess + 0x30))();
          if (lVar6 != lVar4) {
            this_00 = (E *)__cxa_allocate_exception(0x28);
            E::E(this_00,
                 "TOICompactRewardDecPOMDPDiscrete::SetInitialized(true) : all agents are required to have the same state space (same number of individual states)"
                );
            goto LAB_00474bfe;
          }
          uVar7 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                         super_TransitionObservationIndependentMADPDiscrete.
                                         super_MultiAgentDecisionProcess + 0x10))(this);
          bVar3 = uVar7 != uVar5;
          uVar7 = uVar5;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar3);
      }
    }
    lVar4 = 0;
    do {
      uVar8 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                     super_TransitionObservationIndependentMADPDiscrete.
                                     _m_individualMADPDs.
                                     super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar4]->
                                     super_MultiAgentDecisionProcess + 0x30))();
      *(undefined8 *)(*(long *)&(this->super_TOIDecPOMDPDiscrete).field_0x2c0 + lVar4 * 8) = uVar8;
      uVar9 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                     super_TransitionObservationIndependentMADPDiscrete.
                                     _m_individualMADPDs.
                                     super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar4]->
                                     super_MultiAgentDecisionProcess + 0x70))();
      (this->_m_nrTwoAgentActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar4] = uVar9;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
  }
  (this->super_TOIDecPOMDPDiscrete).field_0x2b8 = b;
  return true;
}

Assistant:

bool TOICompactRewardDecPOMDPDiscrete::SetInitialized(bool b)
{
    if(b == false)
    {
        _m_initialized = false;
        return(true);
    }

    if( TOIDecPOMDPDiscrete::SetInitialized(true))
    {
        if( b == true )
        {
            if (_m_p_rModels.size()!=GetNrAgents())
                throw E("TOICompactRewardDecPOMDPDiscrete::SetInitialized(true) : no reward models specified yet!");
                
            for(unsigned int i=0;i!=GetNrAgents();++i)
                if (_m_p_rModels[i] == 0)
                    throw E("TOICompactRewardDecPOMDPDiscrete::SetInitialized(true) : no reward model specified yet! ( _m_p_rModels[i] == 0 )");

            size_t nrStates=GetIndividualDecPOMDPD(0)->GetNrStates();
            for(unsigned int i=0;i!=GetNrAgents();++i)
                if(GetIndividualDecPOMDPD(i)->GetNrStates()!=nrStates)
                    throw E("TOICompactRewardDecPOMDPDiscrete::SetInitialized(true) : all agents are required to have the same state space (same number of individual states)");
        }

        for(Index i=0;i!=2;++i)
        {
            _m_nrTwoAgentStates[i]=GetIndividualMADPD(i)->GetNrStates();
            _m_nrTwoAgentActions[i]=GetIndividualMADPD(i)->GetNrJointActions();
        }

        _m_initialized = b;
        return(true);
    }
    else
        return(false);
}